

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O2

void __thiscall
NeuralNetwork::train
          (NeuralNetwork *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *train_xs,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *train_ys,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *test_xs,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *test_ys)

{
  double dVar1;
  uint __line;
  size_type __n;
  size_type __n_00;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  char *__assertion;
  size_type sVar5;
  long lVar6;
  size_type sVar7;
  bool bVar8;
  float fVar9;
  double local_e8;
  void *local_e0 [2];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_d0;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  testYvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  testXvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  trainYvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  trainXvecs;
  
  lVar4 = (long)(train_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(train_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  __n = lVar4 / 0x18;
  if (lVar4 == (long)(train_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(train_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = (long)(test_xs->
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(test_xs->
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    __n_00 = lVar4 / 0x18;
    if (lVar4 == (long)(test_ys->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(test_ys->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) {
      trainXvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      trainXvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      trainXvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      trainYvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      trainYvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      trainYvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      testXvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testXvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      testXvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      testYvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testYvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      testYvecs.
      super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0 = test_xs;
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::reserve(&trainXvecs,__n);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::reserve(&trainYvecs,__n);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::reserve(&testXvecs,__n_00);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::reserve(&testYvecs,__n_00);
      sVar7 = 0;
      if (0 < (long)__n) {
        sVar7 = __n;
      }
      sVar5 = sVar7;
      while (bVar8 = sVar5 != 0, sVar5 = sVar5 - 1, bVar8) {
        stdVecToEigenVec((NeuralNetwork *)local_e0,(vector<float,_std::allocator<float>_> *)this);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&trainXvecs,(Matrix<float,__1,_1,_0,__1,_1> *)local_e0);
        free(local_e0[0]);
      }
      sVar5 = sVar7;
      while (bVar8 = sVar5 != 0, sVar5 = sVar5 - 1, bVar8) {
        stdVecToEigenVec((NeuralNetwork *)local_e0,(vector<float,_std::allocator<float>_> *)this);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&trainYvecs,(Matrix<float,__1,_1,_0,__1,_1> *)local_e0);
        free(local_e0[0]);
      }
      if ((long)__n_00 < 1) {
        __n_00 = 0;
      }
      sVar5 = __n_00;
      while (bVar8 = sVar5 != 0, sVar5 = sVar5 - 1, bVar8) {
        stdVecToEigenVec((NeuralNetwork *)local_e0,(vector<float,_std::allocator<float>_> *)this);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&testXvecs,(Matrix<float,__1,_1,_0,__1,_1> *)local_e0);
        free(local_e0[0]);
      }
      while (bVar8 = __n_00 != 0, __n_00 = __n_00 - 1, bVar8) {
        stdVecToEigenVec((NeuralNetwork *)local_e0,(vector<float,_std::allocator<float>_> *)this);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&testYvecs,(Matrix<float,__1,_1,_0,__1,_1> *)local_e0);
        free(local_e0[0]);
      }
      local_d0 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)(double)(long)__n;
      for (iVar3 = 0; iVar3 < this->epoch_; iVar3 = iVar3 + 1) {
        local_e8 = 0.0;
        lVar4 = std::chrono::_V2::system_clock::now();
        for (lVar6 = 0; sVar7 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
          forwardPropagation(this,(VectorXf *)
                                  ((long)&((trainXvecs.
                                            super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                                          ).m_storage.m_data + lVar6));
          backPropagation(this,(VectorXf *)
                               ((long)&((trainYvecs.
                                         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data + lVar6));
          gradientDescent(this);
          gradientClean(this);
          dVar1 = getLoss(this);
          local_e8 = local_e8 + dVar1;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_5ac0f);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        poVar2 = std::operator<<(poVar2,anon_var_dwarf_5ac28);
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
        lVar6 = std::chrono::_V2::system_clock::now();
        poVar2 = std::ostream::_M_insert<double>((double)(lVar6 - lVar4) / 1000000000.0);
        std::operator<<(poVar2,anon_var_dwarf_5ac41);
        std::ostream::flush();
        *(uint *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) & 0xfffffefb |
             4;
        fVar9 = getAccuracy(this,&testXvecs,&testYvecs);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar9 * 100.0);
        poVar2 = std::operator<<(poVar2,"%,loss: ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
        poVar2 = std::ostream::_M_insert<double>(local_e8 / (double)local_d0);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&testYvecs);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&testXvecs);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&trainYvecs);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&trainXvecs);
      return;
    }
    __assertion = "test_xs.size() == test_ys.size()";
    __line = 0x5d;
  }
  else {
    __assertion = "train_xs.size() == train_ys.size()";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                ,__line,
                "void NeuralNetwork::train(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
               );
}

Assistant:

void NeuralNetwork::train(std::vector<std::vector<float>>& train_xs,
                          std::vector<std::vector<float>>& train_ys,
                          std::vector<std::vector<float>>& test_xs,
                          std::vector<std::vector<float>>& test_ys) {
    using namespace std;
    using namespace chrono;
    using namespace Eigen;
    assert(train_xs.size() == train_ys.size());
    assert(test_xs.size() == test_ys.size());
    ssize_t trainingDataSize = train_xs.size();
    ssize_t testDataSize = test_xs.size();
    vector<VectorXf> trainXvecs, trainYvecs, testXvecs, testYvecs;
    trainXvecs.reserve(trainingDataSize);
    trainYvecs.reserve(trainingDataSize);
    testXvecs.reserve(testDataSize);
    testYvecs.reserve(testDataSize);
    for (int i = 0; i < trainingDataSize; ++i) {
        trainXvecs.push_back(NeuralNetwork::stdVecToEigenVec(train_xs[i]));
        // xvecs.push_back(VectorXf(xs[i].data(),inputSize_));
    }
    for (int i = 0; i < trainingDataSize; ++i) {
        trainYvecs.push_back(NeuralNetwork::stdVecToEigenVec(train_ys[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        testXvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_xs[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        testYvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_ys[i]));
    }
    for (int e = 0; e < epoch_; ++e) {
        int i = 0;
        double trainingLoss = 0;
        auto t = system_clock::now();
        while (i < trainingDataSize) {
            this->forwardPropagation(trainXvecs[i]);
            this->backPropagation(trainYvecs[i]);
            this->gradientDescent();
            this->gradientClean();
            trainingLoss += this->getLoss();
            ++i;
        }
        // cout<<this->layers_[layerCount_-2].weights<<endl;
        // abort();
        cout << "第" << e << "轮已完成,耗时: " << fixed
             << duration<double>(system_clock::now() - t).count() << "秒,准确率：";
        cout.flush();
        cout << fixed << this->getAccuracy(testXvecs, testYvecs) * 100 << R"(%,loss: )" << fixed
             << trainingLoss / trainingDataSize << endl;
    }
}